

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AEAD_Poly1305_64.c
# Opt level: O1

void AEAD_Poly1305_64_poly1305_blocks_finish_
               (Hacl_Impl_Poly1305_64_State_poly1305_state st,uint8_t *input)

{
  Hacl_Impl_Poly1305_64_poly1305_update(st,input);
  Hacl_Impl_Poly1305_64_poly1305_last_pass(st.h);
  return;
}

Assistant:

void
AEAD_Poly1305_64_poly1305_blocks_finish_(
  Hacl_Impl_Poly1305_64_State_poly1305_state st,
  uint8_t *input
)
{
  Hacl_Impl_Poly1305_64_poly1305_update(st, input);
  uint8_t *x2 = input + (uint32_t)16U;
  if (!((uint64_t)0U == (uint64_t)0U))
    Hacl_Impl_Poly1305_64_poly1305_process_last_block(st, x2, (uint64_t)0U);
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut = st;
  uint64_t *h = scrut.h;
  uint64_t *acc = h;
  Hacl_Impl_Poly1305_64_poly1305_last_pass(acc);
}